

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O2

bool __thiscall Am_Input_Char::Exit_If_Stop_Char(Am_Input_Char *this)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = operator==(this,Am_Stop_Character);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Got stop event: exiting Amulet main loop.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return bVar1;
}

Assistant:

bool
Am_Input_Char::Exit_If_Stop_Char() const
{
  if (*this == Am_Stop_Character) {
    std::cerr << "Got stop event: exiting Amulet main loop." << std::endl;
    //    Am_Main_Loop_Go = false;
    return true;
  } else
    return false;
}